

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

EqualLayerParams * __thiscall
CoreML::Specification::EqualLayerParams::New(EqualLayerParams *this,Arena *arena)

{
  EqualLayerParams *this_00;
  
  this_00 = (EqualLayerParams *)operator_new(0x18);
  EqualLayerParams(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<CoreML::Specification::EqualLayerParams>(arena,this_00);
  }
  return this_00;
}

Assistant:

EqualLayerParams* EqualLayerParams::New(::google::protobuf::Arena* arena) const {
  EqualLayerParams* n = new EqualLayerParams;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}